

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_decode.c
# Opt level: O0

int cram_get_bam_seq(cram_fd *fd,bam_seq_t **bam)

{
  cram_record *cr_00;
  cram_slice *s;
  cram_container *c;
  cram_record *cr;
  bam_seq_t **bam_local;
  cram_fd *fd_local;
  
  cr_00 = cram_get_seq(fd);
  if (cr_00 == (cram_record *)0x0) {
    fd_local._4_4_ = -1;
  }
  else {
    fd_local._4_4_ = cram_to_bam(fd->header,fd,fd->ctr->slice,cr_00,fd->ctr->curr_rec + -1,bam);
  }
  return fd_local._4_4_;
}

Assistant:

int cram_get_bam_seq(cram_fd *fd, bam_seq_t **bam) {
    cram_record *cr;
    cram_container *c;
    cram_slice *s;

    if (!(cr = cram_get_seq(fd)))
	return -1;

    c = fd->ctr;
    s = c->slice;

    return cram_to_bam(fd->header, fd, s, cr, c->curr_rec-1, bam);
}